

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_ext(lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext,void *parent)

{
  char **str_p;
  void **ppvVar1;
  ly_stmt lVar2;
  lysp_ext *plVar3;
  lysc_ext_instance *plVar4;
  LY_ERR LVar5;
  long *plVar6;
  lysc_ext *plVar7;
  lysp_ext_instance *plVar8;
  lysp_ext_instance *plVar9;
  lyplg_ext_compile_clb p_Var10;
  lysp_ext_instance *plVar11;
  lyplg_ext *plVar12;
  lys_module *parent_module;
  long lVar13;
  void *pvVar14;
  long lVar15;
  
  str_p = &ext->argument;
  LVar5 = lydict_dup(ctx->ctx,extp->argument,str_p);
  if (LVar5 != LY_SUCCESS) goto LAB_0013e0b2;
  ext->module = ctx->cur_mod;
  ext->parent = parent;
  lVar2 = extp->parent_stmt;
  ext->parent_stmt = lVar2;
  ext->parent_stmt_index = extp->parent_stmt_index;
  if ((short)lVar2 == 0) {
    parent_module = (lys_module *)0x0;
  }
  else {
    parent_module = *(lys_module **)((long)parent + 8);
  }
  lysc_update_path(ctx,parent_module,"{extension}");
  lysc_update_path(ctx,(lys_module *)0x0,extp->name);
  plVar3 = extp->def;
  plVar7 = plVar3->compiled;
  if (plVar7 == (lysc_ext *)0x0) {
    lysc_update_path(ctx,(lys_module *)0x0,"{extension}");
    lysc_update_path(ctx,(lys_module *)0x0,plVar3->name);
    plVar7 = (lysc_ext *)calloc(1,0x30);
    plVar3->compiled = plVar7;
    ext->def = plVar7;
    LVar5 = lydict_dup(ctx->ctx,plVar3->name,(char **)plVar7);
    if (((LVar5 == LY_SUCCESS) &&
        (LVar5 = lydict_dup(ctx->ctx,plVar3->argname,&ext->def->argname), LVar5 == LY_SUCCESS)) &&
       (LVar5 = lysp_ext_find_definition(ctx->ctx,extp,&ext->def->module,(lysp_ext **)0x0),
       LVar5 == LY_SUCCESS)) {
      plVar11 = plVar3->exts;
      if (plVar11 == (lysp_ext_instance *)0x0) {
LAB_0013e216:
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        plVar12 = &extp->record->plugin;
        if (extp->record == (lyplg_ext_record *)0x0) {
          plVar12 = (lyplg_ext *)0x0;
        }
        ext->def->plugin = plVar12;
        plVar7 = plVar3->compiled;
        goto LAB_0013de7c;
      }
      plVar7 = ext->def;
      plVar4 = plVar7->exts;
      if (plVar4 == (lysc_ext_instance *)0x0) {
        plVar6 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
        if (plVar6 != (long *)0x0) {
          pvVar14 = (void *)0x0;
          goto LAB_0013e143;
        }
      }
      else {
        pvVar14 = plVar4[-1].compiled;
        plVar6 = (long *)realloc(&plVar4[-1].compiled,
                                 ((long)&(plVar11[-1].exts)->name + (long)pvVar14 * 2) * 0x48 + 8);
        if (plVar6 != (long *)0x0) {
          plVar7 = ext->def;
LAB_0013e143:
          plVar7->exts = (lysc_ext_instance *)(plVar6 + 1);
          plVar4 = ext->def->exts;
          if (plVar4 != (lysc_ext_instance *)0x0) {
            if (plVar3->exts == (lysp_ext_instance *)0x0) {
              plVar11 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar11 = plVar3->exts[-1].exts;
            }
            memset(plVar4 + *plVar6,0,((long)&plVar11->name + (long)pvVar14) * 0x48);
          }
          lVar13 = 0;
          plVar11 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar8 = plVar3->exts;
            if (plVar8 == (lysp_ext_instance *)0x0) {
              plVar9 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar9 = plVar8[-1].exts;
            }
            if (plVar9 <= plVar11) break;
            plVar7 = ext->def;
            plVar4 = plVar7->exts;
            pvVar14 = plVar4[-1].compiled;
            plVar4[-1].compiled = (void *)((long)pvVar14 + 1);
            LVar5 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar8->name + lVar13),
                                    plVar4 + (long)pvVar14,plVar7);
            if (LVar5 != LY_SUCCESS) {
              if (LVar5 != LY_ENOT) goto LAB_0013df47;
              ppvVar1 = &ext->def->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
            lVar13 = lVar13 + 0x70;
          }
          goto LAB_0013e216;
        }
      }
      LVar5 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_extension");
    }
LAB_0013df47:
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  }
  else {
LAB_0013de7c:
    ext->def = plVar7;
    plVar11 = extp->exts;
    if (plVar11 != (lysp_ext_instance *)0x0) {
      plVar4 = ext->exts;
      if (plVar4 == (lysc_ext_instance *)0x0) {
        plVar6 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
        if (plVar6 == (long *)0x0) goto LAB_0013df9e;
        lVar13 = 0;
        pvVar14 = (void *)0x0;
      }
      else {
        pvVar14 = plVar4[-1].compiled;
        plVar6 = (long *)realloc(&plVar4[-1].compiled,
                                 ((long)&(plVar11[-1].exts)->name + (long)pvVar14 * 2) * 0x48 + 8);
        if (plVar6 == (long *)0x0) {
LAB_0013df9e:
          LVar5 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_ext");
          goto LAB_0013e0b2;
        }
        lVar13 = *plVar6;
      }
      ext->exts = (lysc_ext_instance *)(plVar6 + 1);
      plVar11 = extp->exts;
      if (plVar11 == (lysp_ext_instance *)0x0) {
        plVar8 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar8 = plVar11[-1].exts;
      }
      lVar15 = 0;
      memset(plVar6 + lVar13 * 9 + 1,0,((long)&plVar8->name + (long)pvVar14) * 0x48);
      plVar8 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (plVar11 == (lysp_ext_instance *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = plVar11[-1].exts;
        }
        if (plVar9 <= plVar8) break;
        plVar4 = ext->exts;
        pvVar14 = plVar4[-1].compiled;
        plVar4[-1].compiled = (void *)((long)pvVar14 + 1);
        LVar5 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar11->name + lVar15),
                                plVar4 + (long)pvVar14,ext);
        if (LVar5 != LY_SUCCESS) {
          if (LVar5 != LY_ENOT) goto LAB_0013e0b2;
          ppvVar1 = &ext->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
        plVar11 = extp->exts;
        lVar15 = lVar15 + 0x70;
      }
      plVar7 = ext->def;
    }
    LVar5 = LY_SUCCESS;
    if ((plVar7->plugin == (lyplg_ext *)0x0) ||
       (p_Var10 = plVar7->plugin->compile, p_Var10 == (lyplg_ext_compile_clb)0x0))
    goto LAB_0013e0b2;
    if (*str_p != (char *)0x0) {
      lysc_update_path(ctx,ext->module,*str_p);
      p_Var10 = ext->def->plugin->compile;
    }
    LVar5 = (*p_Var10)(ctx,extp,ext);
    if (LVar5 == LY_ENOT) {
      lysc_ext_instance_free(&ctx->free_ctx,ext);
    }
    if (*str_p == (char *)0x0) goto LAB_0013e0b2;
  }
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
LAB_0013e0b2:
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return LVar5;
}

Assistant:

LY_ERR
lys_compile_ext(struct lysc_ctx *ctx, struct lysp_ext_instance *extp, struct lysc_ext_instance *ext, void *parent)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING_GOTO(ctx->ctx, extp->argument, ext->argument, ret, cleanup);
    ext->module = ctx->cur_mod;
    ext->parent = parent;
    ext->parent_stmt = extp->parent_stmt;
    ext->parent_stmt_index = extp->parent_stmt_index;

    lysc_update_path(ctx, (ext->parent_stmt & LY_STMT_NODE_MASK) ? ((struct lysc_node *)ext->parent)->module : NULL,
            "{extension}");
    lysc_update_path(ctx, NULL, extp->name);

    /* compile extension if not already */
    LY_CHECK_GOTO(ret = lys_compile_extension(ctx, extp, &ext->def), cleanup);

    /* compile nested extensions */
    COMPILE_EXTS_GOTO(ctx, extp->exts, ext->exts, ext, ret, cleanup);

    /* compile this extension */
    if (ext->def->plugin && ext->def->plugin->compile) {
        if (ext->argument) {
            lysc_update_path(ctx, ext->module, ext->argument);
        }
        ret = ext->def->plugin->compile(ctx, extp, ext);
        if (ret == LY_ENOT) {
            lysc_ext_instance_free(&ctx->free_ctx, ext);
        }
        if (ext->argument) {
            lysc_update_path(ctx, NULL, NULL);
        }
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}